

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O3

int __thiscall obx::Store::close(Store *this,int __fd)

{
  __pointer_type pOVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar3;
  int extraout_EAX;
  undefined8 uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *unaff_R14;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->syncClientMutex_);
  if (iVar3 != 0) {
    uVar4 = std::__throw_system_error(iVar3);
    if (unaff_R14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(unaff_R14);
    }
    _Unwind_Resume(uVar4);
  }
  peVar2 = (this->syncClient_).super___shared_ptr<obx::Closable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->syncClient_).super___shared_ptr<obx::Closable,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->syncClient_).super___shared_ptr<obx::Closable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->syncClient_).super___shared_ptr<obx::Closable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&this->syncClientMutex_);
  if (peVar2 != (element_type *)0x0) {
    iVar3 = (**(code **)(*(long *)peVar2 + 0x10))();
    if ((char)iVar3 == '\0') {
      if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (1 < this_00->_M_use_count)) {
        printf("SyncClient still active with %ld references when store got closed\n",
               (ulong)(this_00->_M_use_count - 1));
      }
      iVar3 = (**(code **)(*(long *)peVar2 + 0x18))();
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    iVar3 = extraout_EAX;
  }
  if (this->owned_ == true) {
    LOCK();
    pOVar1 = (this->cStore_)._M_b._M_p;
    (this->cStore_)._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    iVar3 = obx_store_close(pOVar1);
    return iVar3;
  }
  return iVar3;
}

Assistant:

void Store::close() {
    {
        // Clean up SyncClient by explicitly closing it, even if it isn't the only shared_ptr to the instance.
        // This prevents invalid use of store after it's been closed.
        std::shared_ptr<Closable> syncClient;
        {
            std::lock_guard<std::mutex> lock(syncClientMutex_);
            syncClient = std::move(syncClient_);
            syncClient_ = nullptr;  // to make the current state obvious
        }

        if (syncClient && !syncClient->isClosed()) {
#ifndef NDEBUG  // todo we probably want our LOG macros here too
            long useCount = syncClient.use_count();
            if (useCount > 1) {  // print external refs only thus "- 1"
                printf("SyncClient still active with %ld references when store got closed\n", (useCount - 1));
            }
#endif  // NDEBUG
            syncClient->close();
        }
    }

    if (owned_) {
        OBX_store* storeToClose = cStore_.exchange(nullptr);  // Close exactly once
        obx_store_close(storeToClose);
    }
}